

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

string * Kernel::getQuantifiedStr_abi_cxx11_(Unit *u,List<unsigned_int> *nonQuantified)

{
  bool bVar1;
  uint uVar2;
  Term *t;
  Clause *in_RSI;
  string *in_RDI;
  uint var_1;
  FormulaVarIterator fvit;
  Formula *formula;
  uint var;
  TermVarIterator vit;
  uint i;
  uint clen;
  Clause *cl;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> t_map;
  string res;
  Set<unsigned_int,_Lib::DefaultHash> vars;
  undefined4 in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  uint in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 uVar3;
  Formula *in_stack_fffffffffffffdd8;
  FormulaVarIterator *in_stack_fffffffffffffde0;
  string local_208 [16];
  Clause *in_stack_fffffffffffffe08;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffe58;
  Unit *in_stack_fffffffffffffe60;
  string local_100 [36];
  uint local_dc;
  TermVarIterator local_d8;
  uint local_a8;
  uint local_a4;
  Clause *local_a0;
  FormulaVarIterator *in_stack_ffffffffffffff78;
  string local_60 [80];
  Clause *local_10;
  
  local_10 = in_RSI;
  Lib::Set<unsigned_int,_Lib::DefaultHash>::Set((Set<unsigned_int,_Lib::DefaultHash> *)0x865359);
  std::__cxx11::string::string(local_60);
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &stack0xffffffffffffff78);
  SortHelper::collectVariableSorts(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  bVar1 = Unit::isClause(&local_10->super_Unit);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdc4);
  if (bVar1) {
    local_a0 = local_10;
    uVar2 = Clause::length(local_10);
    local_a4 = uVar2;
    for (local_a8 = 0; local_a8 < local_a4; local_a8 = local_a8 + 1) {
      t = (Term *)Clause::operator[](local_a0,local_a8);
      TermVarIterator::TermVarIterator((TermVarIterator *)CONCAT44(uVar3,uVar2),t);
      while (bVar1 = TermVarIterator::hasNext
                               ((TermVarIterator *)
                                CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8)),
            bVar1) {
        local_dc = TermVarIterator::next(&local_d8);
        in_stack_fffffffffffffdaf =
             Lib::List<unsigned_int>::member
                       (in_stack_fffffffffffffd90,
                        (List<unsigned_int> *)
                        CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        if (!(bool)in_stack_fffffffffffffdaf) {
          Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
                    ((Set<unsigned_int,_Lib::DefaultHash> *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd8c);
        }
      }
      TermVarIterator::~TermVarIterator
                ((TermVarIterator *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    }
    Clause::literalsOnlyToString_abi_cxx11_(in_stack_fffffffffffffe08);
    std::__cxx11::string::operator=(local_60,local_100);
    std::__cxx11::string::~string(local_100);
  }
  else {
    FormulaUnit::formula((FormulaUnit *)local_10);
    FormulaVarIterator::FormulaVarIterator(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    while (bVar1 = FormulaVarIterator::hasNext(in_stack_ffffffffffffff78), bVar1) {
      FormulaVarIterator::next((FormulaVarIterator *)&stack0xfffffffffffffe20);
      bVar1 = Lib::List<unsigned_int>::member
                        (in_stack_fffffffffffffd90,
                         (List<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      in_stack_fffffffffffffd94 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd94);
      if (!bVar1) {
        Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
                  ((Set<unsigned_int,_Lib::DefaultHash> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd8c);
      }
    }
    Formula::toString_abi_cxx11_((Formula *)vars._0_8_);
    std::__cxx11::string::operator=(local_60,local_208);
    std::__cxx11::string::~string(local_208);
    FormulaVarIterator::~FormulaVarIterator
              ((FormulaVarIterator *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffdd8,local_60);
  getQuantifiedStr<Lib::Set<unsigned_int,Lib::DefaultHash>>
            ((Set<unsigned_int,_Lib::DefaultHash> *)fvit._free._counts.super_Array<int>._vptr_Array,
             (string *)fvit._bound._counts.super_Array<int>._array,
             (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             fvit._bound._counts.super_Array<int>._capacity,
             fvit._bound._counts.super_Array<int>._vptr_Array._7_1_);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::__cxx11::string::~string(local_60);
  Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set
            ((Set<unsigned_int,_Lib::DefaultHash> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  return in_RDI;
}

Assistant:

std::string getQuantifiedStr(Unit* u, List<unsigned>* nonQuantified=0)
{
  Set<unsigned> vars;
  std::string res;
  DHMap<unsigned,TermList> t_map;
  SortHelper::collectVariableSorts(u,t_map);
  if (u->isClause()) {
    Clause* cl=static_cast<Clause*>(u);
    unsigned clen=cl->length();
    for(unsigned i=0;i<clen;i++) {
      TermVarIterator vit( (*cl)[i] ); //TODO update iterator for two var lits?
      while(vit.hasNext()) {
        unsigned var=vit.next();
        if (List<unsigned>::member(var, nonQuantified)) {
          continue;
        }
        vars.insert(var);
      }
    }
    res=cl->literalsOnlyToString();
  } else {
    Formula* formula=static_cast<FormulaUnit*>(u)->formula();
    FormulaVarIterator fvit( formula );
    while(fvit.hasNext()) {
      unsigned var=fvit.next();
      if (List<unsigned>::member(var, nonQuantified)) {
        continue;
      }
      vars.insert(var);
    }
    res=formula->toString();
  }

  return getQuantifiedStr(vars, res, t_map);
}